

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O2

int compare_timers(void *av,void *bv)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = *(long *)((long)av + 0x10) - now;
  lVar3 = *(long *)((long)bv + 0x10) - now;
  uVar1 = 0xffffffff;
  if (lVar3 <= lVar2) {
    if (lVar3 < lVar2) {
      uVar1 = 1;
    }
    else {
      uVar1 = memcmp(av,bv,8);
      if (uVar1 == 0) {
        uVar1 = 0xffffffff;
        if (*(ulong *)((long)bv + 8) <= *(ulong *)((long)av + 8)) {
          uVar1 = (uint)(*(ulong *)((long)bv + 8) < *(ulong *)((long)av + 8));
        }
      }
    }
  }
  return uVar1;
}

Assistant:

static int compare_timers(void *av, void *bv)
{
    struct timer *a = (struct timer *)av;
    struct timer *b = (struct timer *)bv;
    long at = a->now - now;
    long bt = b->now - now;

    if (at < bt)
        return -1;
    else if (at > bt)
        return +1;

    /*
     * Failing that, compare on the other two fields, just so that
     * we don't get unwanted equality.
     */
#if defined(__LCC__) || defined(__clang__)
    /* lcc won't let us compare function pointers. Legal, but annoying. */
    {
        int c = memcmp(&a->fn, &b->fn, sizeof(a->fn));
        if (c)
            return c;
    }
#else
    if (a->fn < b->fn)
        return -1;
    else if (a->fn > b->fn)
        return +1;
#endif

    if (a->ctx < b->ctx)
        return -1;
    else if (a->ctx > b->ctx)
        return +1;

    /*
     * Failing _that_, the two entries genuinely are equal, and we
     * never have a need to store them separately in the tree.
     */
    return 0;
}